

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

basic_string_view<char,_std::char_traits<char>_> * __thiscall
google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest::
MemoizeProjection<google::protobuf::FieldDescriptor,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__0>
          (DescriptorPoolMemoizationTest *this)

{
  Mutex *this_00;
  GTestFlagSaver *pGVar1;
  bool bVar2;
  pointer prVar3;
  MemoBase *pMVar4;
  _func_int **pp_Var5;
  ReaderMutexLock lock;
  basic_string_view<char,_std::char_traits<char>_> *unaff_R12;
  iterator it;
  iterator it_1;
  pair<const_void_*,_const_void_*> key;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>::iterator,_bool>
  local_80;
  iterator local_68;
  _Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false> local_58;
  key_arg<std::pair<const_void_*,_const_void_*>_> local_50;
  __atomic_base<long> local_40;
  _Head_base<0UL,_std::pair<const_void_*,_const_void_*>_&&,_false> local_38;
  _Head_base<0UL,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_&&,_false>
  local_30;
  
  this_00 = (Mutex *)this[1].super_Test._vptr_Test[3];
  local_50.second =
       &DescriptorPool::
        MemoizeProjection<google::protobuf::FieldDescriptor,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::$_0>(google::protobuf::FieldDescriptor_const*,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::$_0)
        ::type_key;
  local_50.first = this;
  absl::lts_20250127::Mutex::ReaderLock(this_00);
  local_80.first =
       absl::lts_20250127::container_internal::
       raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
       ::find<std::pair<void_const*,void_const*>>
                 ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
                   *)this_00[1].mu_.super___atomic_base<long>._M_i,&local_50);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
              *)this_00[1].mu_.super___atomic_base<long>._M_i);
  local_68.ctrl_ = (ctrl_t *)0x0;
  bVar2 = absl::lts_20250127::container_internal::operator==(&local_80.first,&local_68);
  if (!bVar2) {
    prVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
             ::iterator::operator->(&local_80.first);
    pMVar4 = (prVar3->second)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>.
             _M_head_impl;
    protobuf::internal::
    AssertDownCast<google::protobuf::DescriptorPool::MemoData<std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::DescriptorPool::MemoBase>
              (pMVar4);
    unaff_R12 = (basic_string_view<char,_std::char_traits<char>_> *)(pMVar4 + 1);
  }
  absl::lts_20250127::Mutex::ReaderUnlock(this_00);
  if (bVar2) {
    pMVar4 = (MemoBase *)operator_new(0x18);
    pMVar4->_vptr_MemoBase = (_func_int **)0x0;
    pMVar4[1]._vptr_MemoBase = (_func_int **)0x0;
    pMVar4[2]._vptr_MemoBase = (_func_int **)0x0;
    pMVar4->_vptr_MemoBase = (_func_int **)&PTR__MemoBase_018e7c28;
    pMVar4[1]._vptr_MemoBase = (_func_int **)0x0;
    pMVar4[2]._vptr_MemoBase = (_func_int **)0x0;
    pGVar1 = (this->super_Test).gtest_flag_saver_._M_t.
             super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
             .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
    pp_Var5 = (_func_int **)(ulong)*(ushort *)&pGVar1->catch_exceptions_;
    pMVar4[1]._vptr_MemoBase = pp_Var5;
    pMVar4[2]._vptr_MemoBase = (_func_int **)(&pGVar1->also_run_disabled_tests_ + ~(ulong)pp_Var5);
    absl::lts_20250127::Mutex::Lock(this_00);
    local_40._M_i = this_00[1].mu_.super___atomic_base<long>._M_i;
    local_30._M_head_impl =
         (unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
          *)&local_58;
    local_68.ctrl_ = (ctrl_t *)local_50.first;
    local_68.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)local_50.second;
    local_58._M_head_impl = pMVar4;
    local_38._M_head_impl = (pair<const_void_*,_const_void_*> *)&local_68;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
    ::EmplaceDecomposable::operator()
              (&local_80,&local_40,(pair<const_void_*,_const_void_*> *)&local_68,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::pair<const_void_*,_const_void_*>_&&> *)&local_38,
               (tuple<std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_&&>
                *)&local_30);
    if (local_58._M_head_impl != (MemoBase *)0x0) {
      (*(local_58._M_head_impl)->_vptr_MemoBase[1])();
    }
    local_68.ctrl_ = local_80.first.ctrl_;
    local_68.field_1 = local_80.first.field_1;
    prVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
             ::iterator::operator->(&local_68);
    pMVar4 = (prVar3->second)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>.
             _M_head_impl;
    protobuf::internal::
    AssertDownCast<google::protobuf::DescriptorPool::MemoData<std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::DescriptorPool::MemoBase>
              (pMVar4);
    absl::lts_20250127::Mutex::Unlock(this_00);
    unaff_R12 = (basic_string_view<char,_std::char_traits<char>_> *)(pMVar4 + 1);
  }
  return unaff_R12;
}

Assistant:

const auto& MemoizeProjection(const Desc* descriptor, Func func) {
    return DescriptorPool::MemoizeProjection(descriptor, func);
  }